

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

ON_4fColor __thiscall ON_XMLVariant::AsColor(ON_XMLVariant *this)

{
  Types TVar1;
  ON_XMLVariantPrivate *pOVar2;
  ON_4fColor OVar3;
  ON_4fColor col;
  ON_4fColor local_28;
  ON_Color local_14;
  
  ON_Color::ON_Color(&local_14,0,0,0,0);
  ON_4fColor::ON_4fColor(&local_28,&local_14);
  TVar1 = this->_private->_type;
  if (1 < TVar1 - DoubleArray4) {
    if (TVar1 != String) {
      OVar3.m_color[0] = local_28.m_color[0];
      OVar3.m_color[1] = local_28.m_color[1];
      OVar3.m_color[2] = local_28.m_color[2];
      OVar3.m_color[3] = local_28.m_color[3];
      return (ON_4fColor)OVar3.m_color;
    }
    (*this->_vptr_ON_XMLVariant[0x31])(this,4);
  }
  pOVar2 = this->_private;
  ON_4fColor::SetRGBA(&local_28,(float)(pOVar2->field_2)._double_val,
                      (float)(pOVar2->field_2).m_xform.m_xform[0][1],
                      (float)(pOVar2->field_2).m_xform.m_xform[0][2],
                      (float)(pOVar2->field_2).m_xform.m_xform[0][3]);
  return (ON_4fColor)local_28.m_color;
}

Assistant:

ON_4fColor ON_XMLVariant::AsColor(void) const
{
  ON_4fColor col(ON_Color(0, 0, 0, 0));

  switch (_private->_type)
  {
  case Types::String:
    StringToPoint(4);
    // No break...
  case Types::DoubleArray4:
  case Types::DoubleColor4:
    col.SetRGBA(float(_private->_array_val[0]), float(_private->_array_val[1]), float(_private->_array_val[2]), float(_private->_array_val[3]));
  
  default:
    break;
  }

  return col;
}